

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_return.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::Handle_Return<std::function<int_(int)>_&>::handle
          (Handle_Return<std::function<int_(int)>_&> *this,function<int_(int)> *f)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  shared_ptr<std::function<int_(int)>_> local_40;
  reference_wrapper<std::function<int_(int)>_> local_30;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_28;
  function<int_(int)> *local_18;
  function<int_(int)> *f_local;
  
  local_18 = f;
  f_local = (function<int_(int)> *)this;
  local_30 = std::ref<std::function<int(int)>>(f);
  std::shared_ptr<std::function<int_(int)>_>::shared_ptr(&local_40);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Assignable_Proxy_Function_Impl<int(int)>,std::reference_wrapper<std::function<int(int)>>,std::shared_ptr<std::function<int(int)>>>
            ((chaiscript *)&local_28,&local_30,&local_40);
  Boxed_Value::Boxed_Value<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,void>
            ((Boxed_Value *)this,&local_28,false);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_28);
  std::shared_ptr<std::function<int_(int)>_>::~shared_ptr(&local_40);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value handle(std::function<Ret> &f) {
          return Boxed_Value(chaiscript::make_shared<dispatch::Proxy_Function_Base, dispatch::Assignable_Proxy_Function_Impl<Ret>>(
              std::ref(f), std::shared_ptr<std::function<Ret>>()));
        }